

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>
                   (String *__return_storage_ptr__,Builder *params)

{
  StringTree *params_00;
  StringTree SStack_48;
  
  capnproto_test::capnp::test::TestUnion::Union0::Builder::toString(&SStack_48,params);
  _::concat<kj::StringTree>(__return_storage_ptr__,(_ *)&SStack_48,params_00);
  StringTree::~StringTree(&SStack_48);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}